

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t unpack_half_to_float_3chan_planar(exr_decode_pipeline_t *decode)

{
  int iVar1;
  float *out;
  long *in_RDI;
  int y;
  int linc2;
  int linc1;
  int linc0;
  int h;
  int w;
  uint8_t *out2;
  uint8_t *out1;
  uint8_t *out0;
  uint16_t *in2;
  uint16_t *in1;
  uint16_t *in0;
  uint8_t *srcbuffer;
  undefined4 local_58;
  int w_00;
  int iVar2;
  undefined4 uVar3;
  
  uVar3 = *(undefined4 *)(*in_RDI + 0xc);
  iVar2 = *(int *)((long)in_RDI + 0x24);
  w_00 = *(int *)(*in_RDI + 0x24);
  iVar1 = *(int *)(*in_RDI + 0x84);
  out = *(float **)(*in_RDI + 0x88);
  for (local_58 = 0; local_58 < iVar2; local_58 = local_58 + 1) {
    half_to_float_buffer(out,(uint16_t *)CONCAT44(uVar3,iVar2),w_00);
    half_to_float_buffer(out,(uint16_t *)CONCAT44(uVar3,iVar2),w_00);
    half_to_float_buffer(out,(uint16_t *)CONCAT44(uVar3,iVar2),w_00);
    out = (float *)((long)out + (long)iVar1);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_3chan_planar (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t *       out0, *out1, *out2;
    int             w, h;
    int             linc0, linc1, linc2;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;

    // planar output
    for (int y = 0; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
                            /* specialise to memcpy if we can */
        half_to_float_buffer ((float*) out0, in0, w);
        half_to_float_buffer ((float*) out1, in1, w);
        half_to_float_buffer ((float*) out2, in2, w);

        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
    }

    return EXR_ERR_SUCCESS;
}